

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  ushort uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = pSrc->nColumn;
  iVar5 = 0;
  if (((pDest->nColumn == uVar1) && (iVar5 = 0, pDest->onError == pSrc->onError)) &&
     (iVar5 = 1, (ulong)uVar1 != 0)) {
    piVar2 = pSrc->aiColumn;
    piVar3 = pDest->aiColumn;
    uVar6 = 0;
    do {
      if (((piVar2[uVar6] != piVar3[uVar6]) || (pSrc->aSortOrder[uVar6] != pDest->aSortOrder[uVar6])
          ) || (iVar4 = xferCompatibleCollation(pSrc->azColl[uVar6],pDest->azColl[uVar6]),
               iVar4 == 0)) {
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return iVar5;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nColumn!=pSrc->nColumn ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nColumn; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( !xferCompatibleCollation(pSrc->azColl[i],pDest->azColl[i]) ){
      return 0;   /* Different collating sequences */
    }
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}